

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmanager.cpp
# Opt level: O3

string * __thiscall
ICM::ObjectPtr::to_string_abi_cxx11_(string *__return_storage_ptr__,ObjectPtr *this)

{
  if (this->data == (Object *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Null","");
  }
  else {
    Object::to_string_abi_cxx11_(__return_storage_ptr__,this->data);
  }
  return __return_storage_ptr__;
}

Assistant:

string ObjectPtr::to_string() const {
		if (this->get() == nullptr)
			return "Null";
		return this->get()->to_string();
	}